

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::piece_picker::dec_refcount
          (piece_picker *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask,torrent_peer *peer)

{
  piece_pos *this_00;
  prio_index_t elem_index;
  _Head_base<0UL,_unsigned_int_*,_false> _Var1;
  pointer ppVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  piece_pos *m;
  pointer ppVar7;
  uint *puVar8;
  vector<piece_pos,_piece_index_t> *__range2;
  bitfield **ppbVar9;
  torrent_peer *peer_00;
  int iVar10;
  long lVar11;
  uint uVar12;
  piece_pos *m_1;
  pointer ppVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  bitfield *local_48;
  ulong local_40;
  undefined1 *local_38;
  
  ppbVar9 = &local_48;
  peer_00 = (torrent_peer *)bitmask;
  bVar3 = bitfield::none_set(&bitmask->super_bitfield);
  if (!bVar3) {
    bVar3 = bitfield::all_set(&bitmask->super_bitfield);
    if (bVar3) {
      _Var1._M_head_impl =
           *(uint **)&(bitmask->super_bitfield).m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
          (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *_Var1._M_head_impl;
      }
      if (uVar4 == (uint)((ulong)((long)(this->m_piece_map).
                                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                        .
                                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_piece_map).
                                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       .
                                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        dec_refcount_all(this,peer_00);
        return;
      }
    }
    _Var1._M_head_impl =
         *(uint **)&(bitmask->super_bitfield).m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (int)*_Var1._M_head_impl / 2;
    }
    local_40 = 0x32;
    if ((int)uVar4 < 0x32) {
      local_40 = (ulong)uVar4;
    }
    iVar5 = (int)local_40;
    if ((int)uVar4 < 1) {
      local_38 = (undefined1 *)0x0;
    }
    else {
      ppbVar9 = (bitfield **)((long)&local_48 - (ulong)(iVar5 * 4 + 0xfU & 0xfffffff0));
      local_38 = (undefined1 *)ppbVar9;
    }
    if (this->m_dirty == false) {
      puVar6 = _Var1._M_head_impl + 1;
      if (_Var1._M_head_impl == (uint *)0x0) {
        uVar4 = 0x80000000;
        puVar8 = (uint *)0x0;
        puVar6 = (uint *)0x0;
      }
      else {
        uVar4 = *_Var1._M_head_impl;
        iVar10 = uVar4 + 0x3e;
        if (-1 < (int)(uVar4 + 0x1f)) {
          iVar10 = uVar4 + 0x1f;
        }
        puVar8 = puVar6 + ((long)(iVar10 >> 5) - (ulong)((uVar4 & 0x1f) != 0));
        uVar4 = 0x80000000 >> (sbyte)(uVar4 & 0x1f);
      }
      uVar15 = 0;
      iVar10 = 0;
      uVar12 = 0x80000000;
      do {
        if ((*puVar6 &
            (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18))
            != 0) {
          if ((int)uVar15 < iVar5) {
            *(int *)(local_38 + (long)(int)uVar15 * 4) = iVar10;
          }
          uVar15 = uVar15 + 1;
          if (iVar5 <= (int)uVar15) break;
        }
        bVar3 = uVar12 == 1;
        puVar6 = puVar6 + bVar3;
        uVar12 = uVar12 >> 1;
        if (bVar3) {
          uVar12 = 0x80000000;
        }
        iVar10 = iVar10 + 1;
      } while ((puVar6 != puVar8) || (uVar12 != uVar4));
      if ((int)uVar15 < iVar5) {
        local_48 = &bitmask->super_bitfield;
        if (0 < (int)uVar15) {
          uVar14 = 0;
          do {
            this_00 = (this->m_piece_map).
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      .
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start + *(int *)(local_38 + uVar14 * 4);
            *(undefined8 *)((long)ppbVar9 + -8) = 0x2913f7;
            iVar5 = piece_pos::priority(this_00,this);
            if (((ulong)*this_00 & 0x3ffffff) == 0) {
              this->m_seeds = this->m_seeds + -1;
              ppVar2 = (this->m_piece_map).
                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       .
                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (ppVar7 = (this->m_piece_map).
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            .
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
                  ppVar7 = ppVar7 + 1) {
                *(uint *)ppVar7 = *(uint *)ppVar7 & 0xfc000000 | *(uint *)ppVar7 + 1 & 0x3ffffff;
              }
              this->m_dirty = true;
            }
            *(uint *)this_00 = *(uint *)this_00 & 0xfc000000 | *(uint *)this_00 - 1 & 0x3ffffff;
            if ((-1 < iVar5) && (this->m_dirty == false)) {
              elem_index.m_val = (this_00->index).m_val;
              *(undefined8 *)((long)ppbVar9 + -8) = 0x291466;
              update(this,iVar5,elem_index);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar15);
        }
        bitmask = (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   *)local_48;
        if ((int)uVar15 < (int)local_40) {
          return;
        }
      }
    }
    _Var1._M_head_impl =
         *(uint **)&(((bitfield *)&(bitmask->super_bitfield).m_buf)->m_buf).
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    puVar6 = _Var1._M_head_impl + 1;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      puVar8 = (uint *)0x0;
      uVar4 = 0x80000000;
      puVar6 = (uint *)0x0;
    }
    else {
      uVar4 = *_Var1._M_head_impl;
      iVar5 = uVar4 + 0x3e;
      if (-1 < (int)(uVar4 + 0x1f)) {
        iVar5 = uVar4 + 0x1f;
      }
      puVar8 = puVar6 + ((long)(iVar5 >> 5) - (ulong)((uVar4 & 0x1f) != 0));
      uVar4 = 0x80000000 >> (sbyte)(uVar4 & 0x1f);
    }
    lVar11 = 0;
    bVar3 = false;
    uVar12 = 0x80000000;
    do {
      if ((*puVar6 &
          (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18)) !=
          0) {
        ppVar7 = (this->m_piece_map).
                 super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                 .
                 super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((ulong)ppVar7[lVar11] & 0x3ffffff) == 0) {
          this->m_seeds = this->m_seeds + -1;
          ppVar2 = (this->m_piece_map).
                   super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                   .
                   super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar13 = ppVar7; ppVar13 != ppVar2; ppVar13 = ppVar13 + 1) {
            *(uint *)ppVar13 = *(uint *)ppVar13 & 0xfc000000 | *(uint *)ppVar13 + 1 & 0x3ffffff;
          }
          this->m_dirty = true;
        }
        *(uint *)(ppVar7 + lVar11) =
             *(uint *)(ppVar7 + lVar11) & 0xfc000000 | *(uint *)(ppVar7 + lVar11) - 1 & 0x3ffffff;
        bVar3 = true;
      }
      bVar16 = uVar12 == 1;
      uVar12 = uVar12 >> 1;
      if (bVar16) {
        uVar12 = 0x80000000;
      }
      puVar6 = puVar6 + bVar16;
      lVar11 = lVar11 + 1;
    } while ((puVar6 != puVar8) || (uVar12 != uVar4));
    if (bVar3 && (this->m_dirty & 1U) == 0) {
      this->m_dirty = true;
    }
  }
  return;
}

Assistant:

void piece_picker::dec_refcount(typed_bitfield<piece_index_t> const& bitmask
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif
		TORRENT_ASSERT(bitmask.size() <= int(m_piece_map.size()));

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "dec_refcount(bitfield)" << std::endl;
#endif

		// nothing set, nothing to do here
		if (bitmask.none_set()) return;

		if (bitmask.all_set() && bitmask.size() == int(m_piece_map.size()))
		{
			dec_refcount_all(peer);
			return;
		}

		int const size = std::min(50, int(bitmask.size() / 2));

		// this is an optimization where if just a few
		// pieces end up changing, instead of making
		// the piece list dirty, just update those pieces
		// instead
		TORRENT_ALLOCA(decremented, piece_index_t, size);

		if (!m_dirty)
		{
			// first count how many pieces we're updating. If it's few (less than half)
			// we'll just update them one at a time. Otherwise we'll just update the counters
			// and mark the picker as dirty, so we'll rebuild it next time we need it.
			// this only matters if we're not already dirty, in which case the fasted
			// thing to do is to just update the counters and be done
			piece_index_t index{0};
			int num_dec = 0;
			for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
			{
				if (!*i) continue;
				if (num_dec < size) decremented[num_dec] = index;
				++num_dec;
				if (num_dec >= size) break;
			}

			if (num_dec < size)
			{
				// not that many pieces were updated
				// just update those individually instead of
				// rebuilding the whole piece list
				for (int i = 0; i < num_dec; ++i)
				{
					piece_index_t const piece = decremented[i];
					piece_pos& p = m_piece_map[piece];
					int prev_priority = p.priority(this);

					if (p.peer_count == 0)
					{
						TORRENT_ASSERT(m_seeds > 0);
						// this is the case where we have one or more
						// seeds, and one of them saying: I don't have this
						// piece anymore. we need to break up one of the seed
						// counters into actual peer counters on the pieces
						break_one_seed();
					}

#ifdef TORRENT_DEBUG_REFCOUNTS
					TORRENT_ASSERT(p.have_peers.count(peer) == 1);
					p.have_peers.erase(peer);
#else
					TORRENT_UNUSED(peer);
#endif
					TORRENT_ASSERT(p.peer_count > 0);
					--p.peer_count;
					if (!m_dirty && prev_priority >= 0) update(prev_priority, p.index);
				}
				return;
			}
		}

		piece_index_t index{0};
		bool updated = false;
		for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
		{
			if (*i)
			{
				piece_pos& p = m_piece_map[index];
				if (p.peer_count == 0)
				{
					TORRENT_ASSERT(m_seeds > 0);
					// this is the case where we have one or more
					// seeds, and one of them saying: I don't have this
					// piece anymore. we need to break up one of the seed
					// counters into actual peer counters on the pieces
					break_one_seed();
				}

#ifdef TORRENT_DEBUG_REFCOUNTS
				TORRENT_ASSERT(p.have_peers.count(peer) == 1);
				p.have_peers.erase(peer);
#else
				TORRENT_UNUSED(peer);
#endif

				TORRENT_ASSERT(p.peer_count > 0);
				--p.peer_count;
				updated = true;
			}
		}

		// if we're already dirty, no point in doing anything more
		if (m_dirty) return;

		if (updated) m_dirty = true;
	}